

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifestuff.cpp
# Opt level: O3

int AF_A_HandLower(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  int iVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  PClass *pPVar5;
  DPSprite *this;
  undefined4 in_register_00000014;
  ulong uVar6;
  undefined8 *puVar7;
  VMValue *pVVar8;
  char *__assertion;
  bool bVar9;
  bool bVar10;
  double dVar11;
  undefined1 auVar12 [16];
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  uVar6 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005ff2ab;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    puVar7 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar7 == (undefined8 *)0x0) {
LAB_005ff164:
        puVar7 = (undefined8 *)0x0;
        pVVar8 = param;
      }
      else {
        auVar12._8_8_ = uVar6;
        auVar12._0_8_ = puVar7[1];
        if (puVar7[1] == 0) {
          auVar12 = (**(code **)*puVar7)(puVar7);
          puVar7[1] = auVar12._0_8_;
        }
        pPVar5 = auVar12._0_8_;
        bVar9 = pPVar5 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar9;
        uVar6 = (ulong)bVar9;
        bVar10 = pPVar5 == pPVar4;
        if (!bVar10 && !bVar9) {
          do {
            pPVar5 = pPVar5->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar5 != (PClass *)0x0);
            if (pPVar5 == pPVar4) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        pVVar8 = (VMValue *)(ulong)(bVar10 || bVar9);
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005ff2ab;
        }
      }
      pPVar4 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005ff224;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005ff29b;
        puVar3 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar3 != (undefined8 *)0x0) {
            pPVar5 = (PClass *)puVar3[1];
            if (pPVar5 == (PClass *)0x0) {
              pPVar5 = (PClass *)(**(code **)*puVar3)(puVar3,pVVar8,uVar6,ret);
              puVar3[1] = pPVar5;
            }
            bVar9 = pPVar5 != (PClass *)0x0;
            if (pPVar5 != pPVar4 && bVar9) {
              do {
                pPVar5 = pPVar5->ParentClass;
                bVar9 = pPVar5 != (PClass *)0x0;
                if (pPVar5 == pPVar4) break;
              } while (pPVar5 != (PClass *)0x0);
            }
            if (!bVar9) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005ff2ab;
            }
          }
        }
        else if (puVar3 != (undefined8 *)0x0) goto LAB_005ff29b;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005ff224:
        if ((player_t *)puVar7[0x40] != (player_t *)0x0) {
          this = player_t::GetPSprite((player_t *)puVar7[0x40],PSP_STRIFEHANDS);
          if (this->State == (FState *)0x0) {
            DPSprite::SetState(this,(FState *)0x0,false);
          }
          else {
            dVar11 = this->y + 9.0;
            this->y = dVar11;
            if (256.0 < dVar11) {
              DPSprite::SetState(this,(FState *)0x0,false);
            }
            iVar2 = *(int *)(puVar7[0x40] + 0x138);
            if (0 < iVar2) {
              *(int *)(puVar7[0x40] + 0x138) = iVar2 + -1;
            }
          }
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005ff2ab;
    }
    if (puVar7 == (undefined8 *)0x0) goto LAB_005ff164;
  }
LAB_005ff29b:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005ff2ab:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifestuff.cpp"
                ,0x193,"int AF_A_HandLower(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_HandLower)
{
	PARAM_ACTION_PROLOGUE;

	if (self->player != nullptr)
	{
		DPSprite *psp = self->player->GetPSprite(PSP_STRIFEHANDS);

		if (psp->GetState() == nullptr)
		{
			psp->SetState(nullptr);
			return 0;
		}

		psp->y += 9;
		if (psp->y > WEAPONBOTTOM*2)
		{
			psp->SetState(nullptr);
		}

		if (self->player->extralight > 0) self->player->extralight--;
	}
	return 0;
}